

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha512_End(SHA512_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_64;
  sha2_byte **ppsStack_60;
  int i;
  sha2_byte *d;
  sha2_byte digest [64];
  char *buffer_local;
  SHA512_CTX *context_local;
  
  ppsStack_60 = &d;
  digest._56_8_ = buffer;
  if (buffer == (char *)0x0) {
    memzero(context,0xd0);
  }
  else {
    sha512_Final(context,(sha2_byte *)&d);
    for (local_64 = 0; local_64 < 0x40; local_64 = local_64 + 1) {
      pcVar1 = (char *)(digest._56_8_ + 1);
      *(char *)digest._56_8_ = sha2_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf0) >> 4];
      digest._56_8_ = digest._56_8_ + 2;
      *pcVar1 = sha2_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf)];
      ppsStack_60 = (sha2_byte **)((long)ppsStack_60 + 1);
    }
    *(undefined1 *)digest._56_8_ = 0;
  }
  memzero(&d,0x40);
  return (char *)digest._56_8_;
}

Assistant:

char *sha512_End(trezor::SHA512_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha512_Final(context, digest);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA512_CTX));
	}
	memzero(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}